

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O1

void __thiscall
OpenMD::HBondJump::processNonOverlapping
          (HBondJump *this,int frame,SelectionManager *sman1,SelectionManager *sman2)

{
  ulong *puVar1;
  int iVar2;
  int iVar3;
  pointer ppHVar4;
  long lVar5;
  long lVar6;
  pointer ppAVar7;
  pointer ppAVar8;
  pointer pvVar9;
  Molecule *pMVar10;
  HBondDonor *pHVar11;
  ulong uVar12;
  pointer ppHVar13;
  Atom *pAVar14;
  pointer ppAVar15;
  ulong uVar16;
  int j;
  int i;
  Molecule *local_60;
  int local_58;
  int local_54;
  SelectionManager *local_50;
  long local_48;
  long local_40;
  SelectionManager *local_38;
  
  local_50 = sman2;
  local_38 = sman1;
  local_60 = SelectionManager::beginSelectedMolecule(sman1,&local_54);
  if (local_60 != (Molecule *)0x0) {
    local_40 = (long)frame;
    local_48 = local_40 * 0x18;
    do {
      pMVar10 = SelectionManager::beginSelectedMolecule(local_50,&local_58);
      while (pMVar10 != (Molecule *)0x0) {
        ppHVar13 = (local_60->hBondDonors_).
                   super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppHVar4 = (local_60->hBondDonors_).
                  super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppHVar13 == ppHVar4) {
          pHVar11 = (HBondDonor *)0x0;
        }
        else {
          pHVar11 = *ppHVar13;
        }
        if (pHVar11 != (HBondDonor *)0x0) {
          lVar5 = *(long *)((long)&(((this->GIDtoH_).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data + local_48);
          lVar6 = *(long *)((long)&(((this->acceptor_).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data + local_48);
          ppAVar7 = (pMVar10->hBondAcceptors_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppAVar8 = (pMVar10->hBondAcceptors_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          do {
            if (ppAVar7 == ppAVar8) {
              pAVar14 = (Atom *)0x0;
            }
            else {
              pAVar14 = *ppAVar7;
            }
            if (pAVar14 != (Atom *)0x0) {
              iVar2 = *(int *)(lVar5 + (long)(pHVar11->donatedHydrogen->super_StuntDouble).
                                             globalIndex_ * 4);
              uVar12 = (ulong)iVar2;
              pvVar9 = (this->selected_).
                       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar16 = uVar12 + 0x3f;
              if (-1 < (long)uVar12) {
                uVar16 = uVar12;
              }
              iVar3 = *(int *)(lVar6 + uVar12 * 4);
              ppAVar15 = ppAVar7;
              do {
                ppAVar15 = ppAVar15 + 1;
                if ((pAVar14->super_StuntDouble).globalIndex_ == iVar3) {
                  puVar1 = (ulong *)((ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8
                                     + -8 + *(long *)&pvVar9[local_40].
                                                      super__Bvector_base<std::allocator<bool>_>.
                                                      _M_impl.super__Bvector_impl_data +
                                            ((long)uVar16 >> 6) * 8);
                  *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
                }
                if (ppAVar15 == ppAVar8) {
                  pAVar14 = (Atom *)0x0;
                }
                else {
                  pAVar14 = *ppAVar15;
                }
              } while (pAVar14 != (Atom *)0x0);
            }
            ppHVar13 = ppHVar13 + 1;
            if (ppHVar13 == ppHVar4) {
              pHVar11 = (HBondDonor *)0x0;
            }
            else {
              pHVar11 = *ppHVar13;
            }
          } while (pHVar11 != (HBondDonor *)0x0);
        }
        ppHVar13 = (pMVar10->hBondDonors_).
                   super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppHVar4 = (pMVar10->hBondDonors_).
                  super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppHVar13 == ppHVar4) {
          pHVar11 = (HBondDonor *)0x0;
        }
        else {
          pHVar11 = *ppHVar13;
        }
        if (pHVar11 != (HBondDonor *)0x0) {
          lVar5 = *(long *)((long)&(((this->GIDtoH_).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data + local_48);
          lVar6 = *(long *)((long)&(((this->acceptor_).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data + local_48);
          ppAVar7 = (local_60->hBondAcceptors_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppAVar8 = (local_60->hBondAcceptors_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          do {
            if (ppAVar7 == ppAVar8) {
              pAVar14 = (Atom *)0x0;
            }
            else {
              pAVar14 = *ppAVar7;
            }
            if (pAVar14 != (Atom *)0x0) {
              iVar2 = *(int *)(lVar5 + (long)(pHVar11->donatedHydrogen->super_StuntDouble).
                                             globalIndex_ * 4);
              uVar12 = (ulong)iVar2;
              pvVar9 = (this->selected_).
                       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar16 = uVar12 + 0x3f;
              if (-1 < (long)uVar12) {
                uVar16 = uVar12;
              }
              iVar3 = *(int *)(lVar6 + uVar12 * 4);
              ppAVar15 = ppAVar7;
              do {
                ppAVar15 = ppAVar15 + 1;
                if ((pAVar14->super_StuntDouble).globalIndex_ == iVar3) {
                  puVar1 = (ulong *)((ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) * 8
                                     + -8 + *(long *)&pvVar9[local_40].
                                                      super__Bvector_base<std::allocator<bool>_>.
                                                      _M_impl.super__Bvector_impl_data +
                                            ((long)uVar16 >> 6) * 8);
                  *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
                }
                if (ppAVar15 == ppAVar8) {
                  pAVar14 = (Atom *)0x0;
                }
                else {
                  pAVar14 = *ppAVar15;
                }
              } while (pAVar14 != (Atom *)0x0);
            }
            ppHVar13 = ppHVar13 + 1;
            if (ppHVar13 == ppHVar4) {
              pHVar11 = (HBondDonor *)0x0;
            }
            else {
              pHVar11 = *ppHVar13;
            }
          } while (pHVar11 != (HBondDonor *)0x0);
        }
        pMVar10 = SelectionManager::nextSelectedMolecule(local_50,&local_58);
      }
      local_60 = SelectionManager::nextSelectedMolecule(local_38,&local_54);
    } while (local_60 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void HBondJump::processNonOverlapping(int frame, SelectionManager& sman1,
                                        SelectionManager& sman2) {
    Molecule* mol1;
    Molecule* mol2;
    int i, j;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    int hInd, index, aInd;

    // This is the same as a non-overlapping pairwise loop structure:
    // for (int i = 0;  i < ni ; ++i ) {
    //   for (int j = 0; j < nj; ++j) {}
    // }

    for (mol1 = sman1.beginSelectedMolecule(i); mol1 != NULL;
         mol1 = sman1.nextSelectedMolecule(i)) {
      for (mol2 = sman2.beginSelectedMolecule(j); mol2 != NULL;
           mol2 = sman2.nextSelectedMolecule(j)) {
        // loop over the possible donors in molecule 1:
        for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
             hbd = mol1->nextHBondDonor(hbdi)) {
          hInd  = hbd->donatedHydrogen->getGlobalIndex();
          index = GIDtoH_[frame][hInd];
          aInd  = acceptor_[frame][index];

          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            if (hba->getGlobalIndex() == aInd) {
              selected_[frame][index] = true;
            }
          }
        }

        // loop over the possible donors in molecule 2:
        for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
             hbd = mol2->nextHBondDonor(hbdi)) {
          hInd  = hbd->donatedHydrogen->getGlobalIndex();
          index = GIDtoH_[frame][hInd];
          aInd  = acceptor_[frame][index];

          for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol1->nextHBondAcceptor(hbai)) {
            if (hba->getGlobalIndex() == aInd) {
              selected_[frame][index] = true;
            }
          }
        }
      }
    }
  }